

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall
LLVMBC::BranchInst::BranchInst
          (BranchInst *this,BasicBlock *true_block,BasicBlock *false_block,Value *cond_)

{
  BasicBlock **local_30;
  Value *cond__local;
  BasicBlock *false_block_local;
  BasicBlock *true_block_local;
  BranchInst *this_local;
  
  Instruction::Instruction(&this->super_Instruction,(Type *)0x0,Branch);
  local_30 = this->bbs;
  do {
    *local_30 = (BasicBlock *)0x0;
    local_30 = local_30 + 1;
  } while (local_30 != (BasicBlock **)&this->num_blocks);
  this->num_blocks = 0;
  this->cond = cond_;
  Instruction::set_terminator(&this->super_Instruction);
  this->num_blocks = 2;
  this->bbs[0] = true_block;
  this->bbs[1] = false_block;
  return;
}

Assistant:

BranchInst::BranchInst(BasicBlock *true_block, BasicBlock *false_block, Value *cond_)
    : Instruction(nullptr, ValueKind::Branch)
    , cond(cond_)
{
	set_terminator();
	num_blocks = 2;
	bbs[0] = true_block;
	bbs[1] = false_block;
}